

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O1

Expression * __thiscall
wasm::anon_unknown_0::AsyncifyBuilder::makeStateCheck(AsyncifyBuilder *this,State value)

{
  undefined8 uVar1;
  uintptr_t uVar2;
  Expression *pEVar3;
  Const *pCVar4;
  Binary *this_00;
  anon_union_16_6_1532cd5a_for_Literal_0 local_50;
  undefined8 local_40;
  State local_34;
  
  uVar2 = DAT_010d1bc8;
  uVar1 = wasm::(anonymous_namespace)::ASYNCIFY_STATE;
  local_34 = value;
  pEVar3 = (Expression *)MixedArena::allocSpace(&((this->super_Builder).wasm)->allocator,0x20,8);
  pEVar3->_id = GlobalGetId;
  (pEVar3->type).id = 0;
  *(undefined8 *)(pEVar3 + 1) = 0;
  *(undefined8 *)(pEVar3 + 1) = uVar1;
  pEVar3[1].type.id = uVar2;
  (pEVar3->type).id = 2;
  local_50.i32 = local_34;
  local_40 = 2;
  pCVar4 = Builder::makeConst(&this->super_Builder,(Literal *)&local_50.func);
  this_00 = (Binary *)MixedArena::allocSpace(&((this->super_Builder).wasm)->allocator,0x28,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this_00->op = EqInt32;
  this_00->left = pEVar3;
  this_00->right = (Expression *)pCVar4;
  Binary::finalize(this_00);
  Literal::~Literal((Literal *)&local_50.func);
  return (Expression *)this_00;
}

Assistant:

Expression* makeStateCheck(State value) {
    return makeBinary(EqInt32,
                      makeGlobalGet(ASYNCIFY_STATE, Type::i32),
                      makeConst(Literal(int32_t(value))));
  }